

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v8::detail::
    get_dynamic_spec<fmt::v8::detail::width_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>>,fmt::v8::detail::error_handler>
              (void)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  basic_string_view<char> bVar1;
  handle hVar2;
  undefined1 value_02 [16];
  undefined1 value_03 [16];
  custom_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> custom;
  type tVar3;
  unsigned___int128 *in_stack_00000008;
  undefined2 uStack0000000000000010;
  undefined6 uStack0000000000000012;
  undefined4 in_stack_00000018;
  unsigned_long_long value;
  undefined2 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeea;
  float in_stack_fffffffffffffeec;
  bool bVar4;
  undefined2 in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef2;
  char *message;
  error_handler *in_stack_ffffffffffffff00;
  error_handler *this;
  undefined8 in_stack_ffffffffffffff08;
  width_checker<fmt::v8::detail::error_handler> *in_stack_ffffffffffffff18;
  error_handler local_c0 [8];
  char *local_b8;
  error_handler local_aa;
  monostate local_a9;
  unsigned___int128 *local_a8;
  undefined8 local_a0;
  handle local_98;
  basic_string_view<char> local_88;
  unsigned___int128 *local_78;
  unsigned___int128 *local_68;
  unsigned___int128 *local_58;
  detail *local_50;
  __int128 *local_48;
  __int128 *local_38;
  unsigned___int128 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  error_handler *local_10;
  char *local_8;
  
  this = local_c0;
  width_checker<fmt::v8::detail::error_handler>::width_checker
            ((width_checker<fmt::v8::detail::error_handler> *)this,&local_aa);
  bVar4 = SUB41((uint)in_stack_fffffffffffffeec >> 0x18,0);
  local_18 = &stack0x00000008;
  local_10 = this;
  switch(in_stack_00000018) {
  case 0:
  default:
    monostate::monostate(&local_a9);
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::
                      operator()<fmt::v8::monostate,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)this);
    in_stack_ffffffffffffff00 = this;
    break;
  case 1:
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::operator()<int,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)
                                 CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),
                                 (int)in_stack_fffffffffffffeec);
    break;
  case 2:
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::operator()<unsigned_int,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)
                                 CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),
                                 (uint)in_stack_fffffffffffffeec);
    break;
  case 3:
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::operator()<long_long,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)
                                 CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),
                                 CONCAT44(in_stack_fffffffffffffeec,
                                          CONCAT22(in_stack_fffffffffffffeea,
                                                   in_stack_fffffffffffffee8)));
    break;
  case 4:
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::
                      operator()<unsigned_long_long,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)
                                 CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),
                                 CONCAT44(in_stack_fffffffffffffeec,
                                          CONCAT22(in_stack_fffffffffffffeea,
                                                   in_stack_fffffffffffffee8)));
    break;
  case 5:
    local_28 = in_stack_00000008;
    local_20 = CONCAT62(uStack0000000000000012,uStack0000000000000010);
    value_00._2_2_ = in_stack_fffffffffffffeea;
    value_00._0_2_ = in_stack_fffffffffffffee8;
    value_00._4_4_ = in_stack_fffffffffffffeec;
    value_00._8_2_ = in_stack_fffffffffffffef0;
    value_00._10_6_ = in_stack_fffffffffffffef2;
    local_48 = convert_for_visit<__int128>((__int128 *)in_stack_00000008,(__int128)value_00);
    value_02._8_8_ = in_stack_ffffffffffffff08;
    value_02._0_8_ = in_stack_ffffffffffffff00;
    local_38 = local_48;
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::operator()<__int128,_0>
                                (in_stack_ffffffffffffff18,(__int128)value_02);
    break;
  case 6:
    local_58 = in_stack_00000008;
    local_50 = (detail *)CONCAT62(uStack0000000000000012,uStack0000000000000010);
    value_01._2_2_ = in_stack_fffffffffffffeea;
    value_01._0_2_ = in_stack_fffffffffffffee8;
    value_01._4_4_ = in_stack_fffffffffffffeec;
    value_01._8_2_ = in_stack_fffffffffffffef0;
    value_01._10_6_ = in_stack_fffffffffffffef2;
    local_78 = convert_for_visit<unsigned__int128>
                         (in_stack_00000008,local_50,(unsigned___int128)value_01);
    value_03._8_8_ = in_stack_ffffffffffffff08;
    value_03._0_8_ = in_stack_ffffffffffffff00;
    local_68 = local_78;
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::
                      operator()<unsigned___int128,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)this,
                                 (unsigned___int128)value_03);
    break;
  case 7:
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::operator()<bool,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)
                                 CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),bVar4
                                );
    break;
  case 8:
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::operator()<char,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)
                                 CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),bVar4
                                );
    break;
  case 9:
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::operator()<float,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)
                                 CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),
                                 in_stack_fffffffffffffeec);
    break;
  case 10:
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::operator()<double,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)
                                 CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),
                                 (double)CONCAT44(in_stack_fffffffffffffeec,
                                                  CONCAT22(in_stack_fffffffffffffeea,
                                                           in_stack_fffffffffffffee8)));
    break;
  case 0xb:
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::operator()<long_double,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)
                                 CONCAT62(in_stack_fffffffffffffef2,uStack0000000000000010),
                                 (longdouble)CONCAT28((short)in_stack_00000008,0x12f3fe));
    break;
  case 0xc:
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::operator()<const_char_*,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)
                                 CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),
                                 (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                  CONCAT22(in_stack_fffffffffffffeea,
                                                           in_stack_fffffffffffffee8)));
    break;
  case 0xd:
    basic_string_view<char>::basic_string_view
              (&local_88,(char *)in_stack_00000008,
               CONCAT62(uStack0000000000000012,uStack0000000000000010));
    bVar1.data_._2_2_ = in_stack_fffffffffffffeea;
    bVar1.data_._0_2_ = in_stack_fffffffffffffee8;
    bVar1.data_._4_4_ = in_stack_fffffffffffffeec;
    bVar1.size_._0_2_ = in_stack_fffffffffffffef0;
    bVar1.size_._2_6_ = in_stack_fffffffffffffef2;
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::
                      operator()<fmt::v8::basic_string_view<char>,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)0x12f47b,bVar1);
    break;
  case 0xe:
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::operator()<const_void_*,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)
                                 CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),
                                 (void *)CONCAT44(in_stack_fffffffffffffeec,
                                                  CONCAT22(in_stack_fffffffffffffeea,
                                                           in_stack_fffffffffffffee8)));
    break;
  case 0xf:
    local_a8 = in_stack_00000008;
    local_a0 = CONCAT62(uStack0000000000000012,uStack0000000000000010);
    custom.format._0_2_ = uStack0000000000000010;
    custom.value = in_stack_00000008;
    custom.format._2_6_ = uStack0000000000000012;
    basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>::handle::handle
              (&local_98,custom);
    hVar2.custom_.value._2_2_ = in_stack_fffffffffffffeea;
    hVar2.custom_.value._0_2_ = in_stack_fffffffffffffee8;
    hVar2.custom_.value._4_4_ = in_stack_fffffffffffffeec;
    hVar2.custom_.format._0_2_ = in_stack_fffffffffffffef0;
    hVar2.custom_.format._2_6_ = in_stack_fffffffffffffef2;
    local_8 = (char *)width_checker<fmt::v8::detail::error_handler>::
                      operator()<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>::handle,_0>
                                ((width_checker<fmt::v8::detail::error_handler> *)0x12f504,hVar2);
  }
  local_b8 = local_8;
  message = local_8;
  max_value<int>();
  tVar3 = to_unsigned<int>(0);
  if (message <= (char *)(ulong)tVar3) {
    return (int)local_b8;
  }
  error_handler::on_error(in_stack_ffffffffffffff00,message);
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg, ErrorHandler eh) -> int {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}